

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

bool __thiscall
QWidgetTextControlPrivate::sendMouseEventToInputContext
          (QWidgetTextControlPrivate *this,QEvent *e,Type eventType,MouseButton button,QPointF *pos,
          KeyboardModifiers modifiers,MouseButtons buttons,QPoint *globalPos)

{
  bool bVar1;
  int iVar2;
  Action AVar3;
  QWidgetTextControl *pQVar4;
  qsizetype qVar5;
  int in_EDX;
  long *in_RSI;
  QWidgetTextControlPrivate *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  int cursorPos;
  QTextLayout *layout;
  QWidgetTextControl *q;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int local_74;
  bool local_31;
  QString local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = q_func(in_RDI);
  bVar1 = isPreediting((QWidgetTextControlPrivate *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (bVar1) {
    QTextCursor::block();
    QTextBlock::layout();
    local_74 = (**(code **)(*(long *)pQVar4 + 0x78))(pQVar4,in_R8,1);
    iVar2 = QTextCursor::position();
    local_74 = local_74 - iVar2;
    bVar1 = true;
    if (-1 < local_74) {
      QTextLayout::preeditAreaText();
      qVar5 = QString::size(&local_30);
      bVar1 = qVar5 < local_74;
      QString::~QString((QString *)0x71a07c);
    }
    if (bVar1) {
      local_74 = -1;
    }
    if (-1 < local_74) {
      if (in_EDX == 3) {
        AVar3 = QGuiApplication::inputMethod();
        QInputMethod::invokeAction(AVar3,0);
      }
      (**(code **)(*in_RSI + 0x10))(in_RSI,1);
      local_31 = true;
      goto LAB_0071a0cd;
    }
  }
  local_31 = false;
LAB_0071a0cd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_31;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetTextControlPrivate::sendMouseEventToInputContext(
        QEvent *e, QEvent::Type eventType, Qt::MouseButton button, const QPointF &pos,
        Qt::KeyboardModifiers modifiers, Qt::MouseButtons buttons, const QPoint &globalPos)
{
    Q_UNUSED(eventType);
    Q_UNUSED(button);
    Q_UNUSED(pos);
    Q_UNUSED(modifiers);
    Q_UNUSED(buttons);
    Q_UNUSED(globalPos);
#if !defined(QT_NO_IM)
    Q_Q(QWidgetTextControl);

    if (isPreediting()) {
        QTextLayout *layout = cursor.block().layout();
        int cursorPos = q->hitTest(pos, Qt::FuzzyHit) - cursor.position();

        if (cursorPos < 0 || cursorPos > layout->preeditAreaText().size())
            cursorPos = -1;

        if (cursorPos >= 0) {
            if (eventType == QEvent::MouseButtonRelease)
                QGuiApplication::inputMethod()->invokeAction(QInputMethod::Click, cursorPos);

            e->setAccepted(true);
            return true;
        }
    }
#else
    Q_UNUSED(e);
#endif
    return false;
}